

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O1

int __thiscall GameBoard::init(GameBoard *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  QGridLayout *this_00;
  Field *this_01;
  undefined4 *puVar1;
  int j;
  int i;
  QVector<Field_*> row;
  code *local_68;
  ImplFn local_60;
  Field *local_58;
  undefined8 local_50;
  QMovableArrayOps<QList<Field*>> *local_48;
  QObject local_40 [8];
  QObject local_38 [8];
  
  this->width_ = (int)ctx;
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,(QWidget *)0x0);
  this->layout_ = this_00;
  QWidget::setLayout((QLayout *)this);
  if (0 < this->width_) {
    local_48 = (QMovableArrayOps<QList<Field*>> *)&this->grid_;
    i = 0;
    do {
      row.d.d = (Data *)0x0;
      row.d.ptr = (Field **)0x0;
      row.d.size = 0;
      if (0 < this->width_) {
        j = 0;
        do {
          this_01 = (Field *)operator_new(0x30);
          Field::Field(this_01,i,j,(QWidget *)0x0);
          local_58 = this_01;
          QtPrivate::QPodArrayOps<Field*>::emplace<Field*&>
                    ((QPodArrayOps<Field*> *)&row,row.d.size,&local_58);
          QGridLayout::addWidget(this->layout_,this_01,i,j,0);
          local_58 = (Field *)Field::fieldClicked;
          local_50 = 0;
          local_68 = handleButtonClick;
          local_60 = (ImplFn)0x0;
          puVar1 = (undefined4 *)operator_new(0x20);
          *puVar1 = 1;
          *(code **)(puVar1 + 2) =
               QtPrivate::
               QSlotObject<void_(GameBoard::*)(int,_int),_QtPrivate::List<int,_int>,_void>::impl;
          *(code **)(puVar1 + 4) = handleButtonClick;
          *(undefined8 *)(puVar1 + 6) = 0;
          QObject::connectImpl
                    (local_38,(void **)this_01,(QObject *)&local_58,(void **)this,
                     (QSlotObjectBase *)&local_68,(ConnectionType)puVar1,(int *)0x0,
                     (QMetaObject *)0x0);
          QMetaObject::Connection::~Connection((Connection *)local_38);
          local_58 = (Field *)setTextOnFields;
          local_50 = 0;
          local_68 = QAbstractButton::setText;
          local_60 = (ImplFn)0x0;
          puVar1 = (undefined4 *)operator_new(0x20);
          *puVar1 = 1;
          *(code **)(puVar1 + 2) =
               QtPrivate::
               QSlotObject<void_(QAbstractButton::*)(const_QString_&),_QtPrivate::List<QString>,_void>
               ::impl;
          *(code **)(puVar1 + 4) = QAbstractButton::setText;
          *(undefined8 *)(puVar1 + 6) = 0;
          QObject::connectImpl
                    (local_40,(void **)this,(QObject *)&local_58,(void **)this_01,
                     (QSlotObjectBase *)&local_68,(ConnectionType)puVar1,(int *)0x0,
                     (QMetaObject *)0x0);
          QMetaObject::Connection::~Connection((Connection *)local_40);
          QWidget::setSizePolicy((QSizePolicy)SUB84(this_01,0));
          j = j + 1;
        } while (j < this->width_);
      }
      QtPrivate::QMovableArrayOps<QList<Field*>>::emplace<QList<Field*>const&>
                (local_48,(this->grid_).d.size,&row);
      if (row.d.d != (Data *)0x0) {
        LOCK();
        ((row.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((row.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((row.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(row.d.d)->super_QArrayData,8,8);
        }
      }
      i = i + 1;
    } while (i < this->width_);
  }
  beginNewGame(this);
  return extraout_EAX;
}

Assistant:

void GameBoard::init(int width)
{
    width_ = width;
    layout_ = new QGridLayout;
    setLayout(layout_);

    for(int i = 0; i < width_; i++)
    {
        QVector<Field*> row;
        for(int j = 0; j < width_; j++)
        {
            Field* field = new Field(i,j);
            row.push_back(field);
            layout_->addWidget(field,i,j);

            connect(field, &Field::fieldClicked, this, &GameBoard::handleButtonClick);
            connect(this, &GameBoard::setTextOnFields, field, &Field::setText);
            field->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred); //Make field resize when given more space

        }
        grid_.push_back(row);
    }

    beginNewGame();
}